

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

bool __thiscall
SQCompilation::FunctionReturnTypeEvaluator::checkNode
          (FunctionReturnTypeEvaluator *this,Statement *n)

{
  byte *pbVar1;
  TreeOp TVar2;
  bool bVar3;
  bool bVar4;
  byte unaff_R12B;
  byte bVar5;
  
  bVar5 = 1;
  bVar4 = false;
LAB_0014f80d:
  while (TVar2 = (((SwitchStatement *)n)->super_Statement).super_Node._op, TVar2 - TO_WHILE < 4) {
    n = (Statement *)((SwitchStatement *)n)->_expr;
    unaff_R12B = unaff_R12B & bVar4;
    bVar4 = true;
  }
  switch(TVar2) {
  case TO_BLOCK:
    bVar3 = checkBlock(this,(Block *)n);
LAB_0014f895:
    if (!bVar4) {
      unaff_R12B = bVar3 & bVar5;
    }
    return (bool)(unaff_R12B & 1);
  case TO_IF:
    bVar3 = checkIf(this,(IfStatement *)n);
    goto LAB_0014f895;
  default:
    bVar3 = false;
    goto LAB_0014f895;
  case TO_SWITCH:
    bVar3 = checkSwitch(this,(SwitchStatement *)n);
    goto LAB_0014f895;
  case TO_RETURN:
    if (((SwitchStatement *)n)->_expr == (Expr *)0x0) {
      *(byte *)&this->flags = (byte)this->flags | 1;
    }
    else {
      checkExpr(this,((SwitchStatement *)n)->_expr);
    }
    break;
  case TO_THROW:
    pbVar1 = (byte *)((long)&this->flags + 1);
    *pbVar1 = *pbVar1 | 4;
    break;
  case TO_TRY:
    goto switchD_0014f834_caseD_a;
  }
  bVar3 = true;
  goto LAB_0014f895;
switchD_0014f834_caseD_a:
  bVar3 = checkNode(this,(Statement *)((SwitchStatement *)n)->_expr);
  n = (Statement *)(((SwitchStatement *)n)->_cases)._vals;
  bVar5 = bVar5 & bVar3;
  goto LAB_0014f80d;
}

Assistant:

bool FunctionReturnTypeEvaluator::checkNode(const Statement *n) {
  switch (n->op())
  {
  case TO_RETURN: return checkReturn(static_cast<const ReturnStatement *>(n));
  case TO_THROW: return checkThrow(static_cast<const ThrowStatement *>(n));
  case TO_FOR: case TO_FOREACH: case TO_WHILE: case TO_DOWHILE:
    return checkLoop(static_cast<const LoopStatement *>(n));
  case TO_IF: return checkIf(static_cast<const IfStatement *>(n));
  case TO_SWITCH: return checkSwitch(static_cast<const SwitchStatement *>(n));
  case TO_BLOCK: return checkBlock(static_cast<const Block *>(n));
  case TO_TRY: return checkTry(static_cast<const TryStatement *>(n));
  default:
    return false;
  }
}